

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O1

_Bool COSE_Sign0_Free(HCOSE_SIGN0 h)

{
  _Bool _Var1;
  COSE_Sign0Message *p;
  
  if (h == (HCOSE_SIGN0)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = _COSE_IsInList(Sign0Root,(COSE *)h);
  }
  if (_Var1 != false) {
    if (*(int *)(h + 0x10) < 2) {
      _COSE_RemoveFromList(&Sign0Root,(COSE *)h);
      _COSE_Release((COSE *)h);
      free(h);
    }
    else {
      *(int *)(h + 0x10) = *(int *)(h + 0x10) + -1;
    }
  }
  return _Var1;
}

Assistant:

bool COSE_Sign0_Free(HCOSE_SIGN0 h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Sign0Message * pMessage = (COSE_Sign0Message *)h;

	if (!IsValidSign0Handle(h)) return false;

	//  Check reference counting
	if (pMessage->m_message.m_refCount > 1) {
		pMessage->m_message.m_refCount--;
		return true;
	}

	_COSE_RemoveFromList(&Sign0Root, &pMessage->m_message);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	_COSE_Sign0_Release(pMessage);

	COSE_FREE(pMessage, context);

	return true;
}